

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.cpp
# Opt level: O2

MessageBuilder * __thiscall
tcu::MessageBuilder::operator=(MessageBuilder *this,MessageBuilder *other)

{
  string local_30 [32];
  
  this->m_log = other->m_log;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str((string *)&this->field_0x10);
  std::__cxx11::string::~string(local_30);
  return this;
}

Assistant:

MessageBuilder& MessageBuilder::operator= (const MessageBuilder& other)
{
	m_log = other.m_log;
	m_str.str(other.m_str.str());
	return *this;
}